

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed.cc
# Opt level: O0

Attribute *
tinyusdz::tydra::anon_unknown_2::ToAttributeConnection<unsigned_long>
          (Attribute *__return_storage_ptr__,TypedAttribute<unsigned_long> *input)

{
  bool bVar1;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  Variability *pVVar2;
  string local_60;
  string local_40;
  undefined1 local_19;
  TypedAttribute<unsigned_long> *local_18;
  TypedAttribute<unsigned_long> *input_local;
  Attribute *attr;
  
  local_19 = 0;
  local_18 = input;
  input_local = (TypedAttribute<unsigned_long> *)__return_storage_ptr__;
  Attribute::Attribute(__return_storage_ptr__);
  bVar1 = TypedAttribute<unsigned_long>::is_blocked(local_18);
  if (bVar1) {
    Attribute::set_blocked(__return_storage_ptr__,true);
    pVVar2 = Attribute::variability(__return_storage_ptr__);
    *pVVar2 = Uniform;
  }
  else {
    bVar1 = TypedAttribute<unsigned_long>::is_value_empty(local_18);
    if (bVar1) {
      TypedAttribute<unsigned_long>::type_name_abi_cxx11_();
      Attribute::set_type_name(__return_storage_ptr__,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
      pVVar2 = Attribute::variability(__return_storage_ptr__);
      *pVVar2 = Uniform;
    }
    else {
      bVar1 = TypedAttribute<unsigned_long>::is_connection(local_18);
      if (bVar1) {
        paths = TypedAttribute<unsigned_long>::connections(local_18);
        Attribute::set_connections(__return_storage_ptr__,paths);
      }
      else {
        TypedAttribute<unsigned_long>::type_name_abi_cxx11_();
        Attribute::set_type_name(__return_storage_ptr__,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        pVVar2 = Attribute::variability(__return_storage_ptr__);
        *pVVar2 = Uniform;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Attribute ToAttributeConnection(
  const TypedAttribute<T> &input)
{
  Attribute attr;
  if (input.is_blocked()) {
    attr.set_blocked(true);
    attr.variability() = Variability::Uniform;
  } else if (input.is_value_empty()) {
    // empty = set type info only
    attr.set_type_name(input.type_name());
    attr.variability() = Variability::Uniform;

  } else if (input.is_connection()) {

    attr.set_connections(input.connections());

  } else{
    attr.set_type_name(input.type_name());
    attr.variability() = Variability::Uniform;
  }

  return attr;
}